

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O3

void __thiscall ThreadWrapper::ThreadWrapper(ThreadWrapper *this)

{
  uint uVar1;
  pthread_t pVar2;
  ulong uVar3;
  __atomic_base<int> _Var4;
  
  pVar2 = pthread_self();
  this->mySelf = pVar2;
  _Var4._M_i = 0;
  uVar3 = syscall(0xba);
  this->myTid = (uint32_t)uVar3;
  if ((uint32_t)uVar3 != 0) {
    _Var4._M_i = 0;
    do {
      _Var4._M_i = _Var4._M_i + 1;
      uVar1 = (uint)uVar3;
      uVar3 = (uVar3 & 0xffffffff) / 10;
    } while (9 < uVar1);
  }
  if ((int)tid_digits.super___atomic_base<int>._M_i < _Var4._M_i) {
    LOCK();
    UNLOCK();
    tid_digits.super___atomic_base<int>._M_i = (__atomic_base<int>)(__atomic_base<int>)_Var4._M_i;
  }
  if (SimpleLoggerMgr::instance._M_b._M_p == (__pointer_type)0x0) {
    return;
  }
  SimpleLoggerMgr::addThread((SimpleLoggerMgr *)SimpleLoggerMgr::instance._M_b._M_p,this->mySelf);
  return;
}

Assistant:

ThreadWrapper() {
        mySelf = (uint64_t)pthread_self();
        myTid = (uint32_t)syscall(SYS_gettid);

        // Get the number of digits for alignment.
        int num_digits = 0;
        uint32_t tid = myTid;
        while (tid) {
            num_digits++;
            tid /= 10;
        }
        int exp = tid_digits;
        const size_t MAX_NUM_CMP = 10;
        size_t count = 0;
        while (exp < num_digits && count++ < MAX_NUM_CMP) {
            if (tid_digits.compare_exchange_strong(exp, num_digits)) {
                break;
            }
            exp = tid_digits;
        }

        SimpleLoggerMgr* mgr = SimpleLoggerMgr::getWithoutInit();
        if (mgr) {
            mgr->addThread(mySelf);
        }
    }